

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O1

void __thiscall jaegertracing::Span::Span(Span *this,Span *span)

{
  SpanContext local_e0;
  
  (this->super_Span)._vptr_Span = (_func_int **)&PTR__Span_002667e0;
  (this->_tracer).super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->_tracer).super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_context).super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00266878;
  (this->_context)._traceID._high = 0;
  (this->_context)._traceID._low = 0;
  (this->_context)._spanID = 0;
  (this->_context)._parentID = 0;
  (this->_context)._flags = '\0';
  (this->_context)._baggage._M_h._M_buckets = &(this->_context)._baggage._M_h._M_single_bucket;
  (this->_context)._baggage._M_h._M_bucket_count = 1;
  (this->_context)._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_context)._baggage._M_h._M_element_count = 0;
  (this->_context)._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_context)._baggage._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_context)._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_context)._debugID._M_dataplus._M_p = (pointer)&(this->_context)._debugID.field_2;
  (this->_context)._debugID._M_string_length = 0;
  (this->_context)._debugID.field_2._M_local_buf[0] = '\0';
  (this->_context)._mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_context)._mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_context)._mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_context)._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_context)._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_operationName)._M_dataplus._M_p = (pointer)&(this->_operationName).field_2;
  (this->_operationName)._M_string_length = 0;
  (this->_operationName).field_2._M_local_buf[0] = '\0';
  (this->_startTimeSystem).__d.__r = 0;
  (this->_startTimeSteady).__d.__r = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  (this->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_references).
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_logs).
  super__Vector_base<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_logs).
  super__Vector_base<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_logs).
  super__Vector_base<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::lock<std::mutex,std::mutex>(&this->_mutex,&span->_mutex);
  (this->_tracer).super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (span->_tracer).super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_tracer).
              super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(span->_tracer).
              super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  SpanContext::SpanContext(&local_e0,&span->_context);
  SpanContext::swap(&this->_context,&local_e0);
  local_e0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_00266878;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._debugID._M_dataplus._M_p != &local_e0._debugID.field_2) {
    operator_delete(local_e0._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e0._baggage._M_h);
  std::__cxx11::string::_M_assign((string *)&this->_operationName);
  (this->_startTimeSystem).__d.__r = (span->_startTimeSystem).__d.__r;
  (this->_startTimeSteady).__d.__r = (span->_startTimeSteady).__d.__r;
  (this->_duration).__r = (span->_duration).__r;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
            (&this->_tags,&span->_tags);
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::operator=
            (&this->_logs,&span->_logs);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::operator=
            (&this->_references,&span->_references);
  pthread_mutex_unlock((pthread_mutex_t *)&span->_mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

Span(const Span& span)
    {
        std::lock(_mutex, span._mutex);
        std::lock_guard<std::mutex> lock(_mutex, std::adopt_lock);
        std::lock_guard<std::mutex> spanLock(span._mutex, std::adopt_lock);

        _tracer = span._tracer;
        _context = span._context;
        _operationName = span._operationName;
        _startTimeSystem = span._startTimeSystem;
        _startTimeSteady = span._startTimeSteady;
        _duration = span._duration;
        _tags = span._tags;
        _logs = span._logs;
        _references = span._references;
    }